

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O1

void Nf_ManCutMatchOne(Nf_Man_t *p,int iObj,int *pCut,int *pCutSet)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Nf_Obj_t *pNVar8;
  Vec_Int_t *pVVar9;
  Mio_Cell2_t *pMVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  byte bVar14;
  uint uVar15;
  uint *puVar16;
  long lVar17;
  uint uVar18;
  long lVar19;
  uint uVar20;
  bool bVar21;
  float fVar22;
  Nf_Obj_t *pBestF [6];
  int local_a8;
  long alStack_68 [7];
  
  uVar2 = *pCut;
  if (p->vTt2Match->nSize <= (int)(uVar2 >> 6)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                  ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  lVar17 = (long)iObj * 0x40;
  uVar20 = uVar2 & 0x1f;
  local_a8 = (int)pCutSet;
  if (uVar20 == 0) {
    if (0x3f < uVar2) {
      __assert_fail("iFuncLit == 0 || iFuncLit == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                    ,0x45a,"void Nf_ManCutMatchOne(Nf_Man_t *, int, int *, int *)");
    }
    uVar20 = ((int)pCut - local_a8 & 0xffcU) << 0x12;
    lVar19 = 0;
    do {
      uVar18 = (uint)lVar19 ^ (uint)(uVar2 >> 5 == 1);
      pNVar8 = p->pNfObjs;
      *(undefined4 *)((long)&pNVar8->M[0][1].D + lVar17) = 0;
      *(undefined4 *)((long)&pNVar8->M[0][0].D + lVar17) = 0;
      fVar22 = p->pCells[uVar18].AreaF;
      *(float *)((long)&pNVar8->M[0][1].F + lVar17) = fVar22;
      *(float *)((long)&pNVar8->M[0][0].F + lVar17) = fVar22;
      if (pCut <= pCutSet) goto LAB_0077da31;
      uVar11 = *(uint *)(&pNVar8->M[0][0].field_0x0 + lVar17);
      *(uint *)(&pNVar8->M[0][1].field_0x0 + lVar17) =
           *(uint *)(&pNVar8->M[0][1].field_0x0 + lVar17) & 0xc0000000 | uVar20 | uVar18;
      *(uint *)(&pNVar8->M[0][0].field_0x0 + lVar17) = uVar11 & 0xc0000000 | uVar20 | uVar18;
      *(undefined4 *)(&pNVar8->M[0][1].Cfg.field_0x0 + lVar17) = 0;
      *(undefined4 *)(&pNVar8->M[0][0].Cfg.field_0x0 + lVar17) = 0;
      lVar19 = lVar19 + 1;
      lVar17 = lVar17 + 0x20;
    } while (lVar19 == 1);
  }
  else {
    pNVar8 = p->pNfObjs;
    uVar18 = (uVar2 >> 6) << 4;
    pVVar9 = p->vTt2Match->pArray;
    uVar13 = 0;
    do {
      alStack_68[uVar13] = (long)(pNVar8 + pCut[uVar13 + 1]);
      uVar13 = uVar13 + 1;
    } while (uVar20 != uVar13);
    if (1 < *(int *)((long)&pVVar9->nSize + (ulong)uVar18)) {
      if (iObj < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      uVar11 = ((int)pCut - local_a8 & 0xffcU) << 0x12;
      lVar17 = 0;
      do {
        lVar19 = *(long *)((long)&pVVar9->pArray + (ulong)uVar18);
        uVar3 = *(uint *)(lVar19 + 4 + lVar17 * 4);
        uVar15 = (uVar3 ^ uVar2 >> 5) & 1;
        uVar12 = uVar15 | iObj * 2;
        if ((p->vRequired).nSize <= (int)uVar12) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar4 = *(int *)(lVar19 + lVar17 * 4);
        pMVar10 = p->pCells;
        if (uVar20 != *(uint *)&pMVar10[iVar4].field_0x10 >> 0x1c) {
          __assert_fail("nFans == (int)pC->nFanins",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                        ,0x472,"void Nf_ManCutMatchOne(Nf_Man_t *, int, int *, int *)");
        }
        iVar5 = (p->vRequired).pArray[uVar12];
        puVar16 = (uint *)(&pNVar8[iObj].M[0][0].field_0x0 + (uVar15 << 5));
        fVar22 = pMVar10[iVar4].AreaF;
        bVar14 = 0;
        uVar13 = 0;
        uVar12 = 0;
        do {
          bVar21 = ((uVar3 >> 1 & 0x7f) >> ((uint)uVar13 & 0x1f) & 1) != 0;
          lVar19 = alStack_68[(uVar3 >> 8) >> (bVar14 & 0x1f) & 0xf];
          iVar6 = pMVar10[iVar4].iDelays[uVar13];
          iVar7 = *(int *)(lVar19 + 8 + (ulong)bVar21 * 0x20);
          if ((iVar5 == 0x3fffffff) ||
             (uVar15 = *(int *)(lVar19 + 0x18 + (ulong)bVar21 * 0x20) + iVar6, iVar5 < (int)uVar15))
          {
            if (((int)puVar16[2] < 0x3fffffff) &&
               (((int)puVar16[6] < 0x3fffffff && (iVar5 < iVar6 + iVar7)))) goto LAB_0077d93c;
            uVar15 = iVar6 + iVar7;
            if ((int)uVar12 <= (int)uVar15) {
              uVar12 = uVar15;
            }
            if ((1e+32 <= fVar22) ||
               (fVar1 = *(float *)(lVar19 + 0xc + (ulong)bVar21 * 0x20), 1e+32 <= fVar1)) {
              fVar22 = 1e+32;
            }
            else {
              fVar22 = fVar22 + fVar1;
            }
          }
          else {
            if ((int)uVar12 <= (int)uVar15) {
              uVar12 = uVar15;
            }
            fVar22 = fVar22 + *(float *)(lVar19 + 0x1c + (ulong)bVar21 * 0x20);
          }
          uVar13 = uVar13 + 1;
          bVar14 = bVar14 + 4;
        } while (uVar20 != uVar13);
        if ((int)uVar12 < (int)puVar16[2]) {
          puVar16[2] = uVar12;
          puVar16[3] = (uint)fVar22;
          if (pCut <= pCutSet) {
LAB_0077da31:
            __assert_fail("pCut > pCutSet",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                          ,0x93,"int Nf_CutHandle(int *, int *)");
          }
          uVar15 = *puVar16;
          *puVar16 = uVar15 & 0xc00fffff | uVar11;
          *puVar16 = uVar15 & 0xc0000000 | uVar11 | *(uint *)&pMVar10[iVar4].field_0x10 & 0xfffff;
          puVar16[1] = uVar3 & 0xfffffffe;
        }
        if (fVar22 + 0.001 < (float)puVar16[7]) {
          puVar16[6] = uVar12;
          puVar16[7] = (uint)fVar22;
          if (pCut <= pCutSet) goto LAB_0077da31;
          uVar12 = puVar16[4];
          puVar16[4] = uVar12 & 0xc00fffff | uVar11;
          puVar16[4] = uVar12 & 0xc0000000 | uVar11 | *(uint *)&pMVar10[iVar4].field_0x10 & 0xfffff;
          puVar16[5] = uVar3 & 0xfffffffe;
        }
LAB_0077d93c:
        lVar17 = lVar17 + 2;
      } while ((int)((uint)lVar17 | 1) < *(int *)((long)&pVVar9->nSize + (ulong)uVar18));
    }
  }
  return;
}

Assistant:

void Nf_ManCutMatchOne( Nf_Man_t * p, int iObj, int * pCut, int * pCutSet )
{
    Nf_Obj_t * pBest = Nf_ManObj(p, iObj);
    int * pFans      = Nf_CutLeaves(pCut);
    int nFans        = Nf_CutSize(pCut);
    int iFuncLit     = Nf_CutFunc(pCut);
    int fComplExt    = Abc_LitIsCompl(iFuncLit);
    Vec_Int_t * vArr = Vec_WecEntry( p->vTt2Match, Abc_Lit2Var(iFuncLit) );
    int i, k, c, Info, Offset, iFanin, fComplF;
    int ArrivalD, ArrivalA;
    Nf_Mat_t * pD, * pA;
    // assign fanins matches
    Nf_Obj_t * pBestF[NF_LEAF_MAX];
    for ( i = 0; i < nFans; i++ )
        pBestF[i] = Nf_ManObj( p, pFans[i] );
    // special cases
    if ( nFans == 0 )
    {
        int Const = (iFuncLit == 1);
        assert( iFuncLit == 0 || iFuncLit == 1 );
        for ( c = 0; c < 2; c++ )
        { 
            pD = Nf_ObjMatchD( p, iObj, c );
            pA = Nf_ObjMatchA( p, iObj, c );
            pD->D = pA->D = 0;
            pD->F = pA->F = p->pCells[c ^ Const].AreaF;
            pD->CutH = pA->CutH = Nf_CutHandle(pCutSet, pCut);
            pD->Gate = pA->Gate = c ^ Const;
//            pD->Conf = pA->Conf = 0;
            pD->Cfg = pA->Cfg = Nf_Int2Cfg(0);
        }
        return;
    }
    // consider matches of this function
    Vec_IntForEachEntryDouble( vArr, Info, Offset, i )
    {
        Nf_Cfg_t Cfg   = Nf_Int2Cfg(Offset);
        Mio_Cell2_t*pC = Nf_ManCell( p, Info );
        int fCompl     = Cfg.fCompl ^ fComplExt;
        int Required   = Nf_ObjRequired( p, iObj, fCompl ), Delay = 0;
        Nf_Mat_t * pD  = &pBest->M[fCompl][0];
        Nf_Mat_t * pA  = &pBest->M[fCompl][1];
        float AreaF    = pC->AreaF;
        assert( nFans == (int)pC->nFanins );
        Nf_CfgForEachVarCompl( Cfg, nFans, iFanin, fComplF, k )
        {
            ArrivalD  = pBestF[iFanin]->M[fComplF][0].D;
            ArrivalA  = pBestF[iFanin]->M[fComplF][1].D;
            if ( ArrivalA + pC->iDelays[k] <= Required && Required != SCL_INFINITY )
            {
                Delay = Abc_MaxInt( Delay, ArrivalA + pC->iDelays[k] );
                AreaF += pBestF[iFanin]->M[fComplF][1].F;
            }
            else 
            {
                if ( pD->D < SCL_INFINITY && pA->D < SCL_INFINITY && ArrivalD + pC->iDelays[k] > Required )
                    break;
                Delay = Abc_MaxInt( Delay, ArrivalD + pC->iDelays[k] );
                //AreaF += pBestF[iFanin]->M[fComplF][0].F;
                if ( AreaF >= (float)1e32 || pBestF[iFanin]->M[fComplF][0].F >= (float)1e32 )
                    AreaF = (float)1e32;
                else 
                    AreaF += pBestF[iFanin]->M[fComplF][0].F;
            }
        }
        if ( k < nFans )
            continue;
        // select best Cfgch
        if ( pD->D > Delay )
        {
            pD->D = Delay;
            pD->F = AreaF;
            pD->CutH = Nf_CutHandle(pCutSet, pCut);
            pD->Gate = pC->Id;
            pD->Cfg = Cfg;
            pD->Cfg.fCompl = 0;
        }

        if ( pA->F > AreaF + NF_EPSILON )
        {
            pA->D = Delay;
            pA->F = AreaF;
            pA->CutH = Nf_CutHandle(pCutSet, pCut);
            pA->Gate = pC->Id;
            pA->Cfg = Cfg;
            pA->Cfg.fCompl = 0;
        }
    }
}